

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_ipp.hpp
# Opt level: O2

shared_ptr<duckdb::ArrowArrayWrapper,_true> * __thiscall
duckdb::shared_ptr<duckdb::ArrowArrayWrapper,_true>::operator=
          (shared_ptr<duckdb::ArrowArrayWrapper,_true> *this,
          shared_ptr<duckdb::ArrowArrayWrapper,_true> *other)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  if (this != other) {
    ::std::__shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_18,
               (__shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2> *)other);
    peVar1 = (this->internal).
             super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = (this->internal).
             super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->internal).super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = local_18._M_ptr;
    (this->internal).super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_18._M_refcount._M_pi;
    local_18._M_ptr = peVar1;
    local_18._M_refcount._M_pi = p_Var2;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18._M_refcount);
  }
  return this;
}

Assistant:

shared_ptr<T> &operator=(const shared_ptr &other) noexcept {
		if (this == &other) {
			return *this;
		}
		// Create a new shared_ptr using the copy constructor, then swap out the ownership to *this
		shared_ptr(other).swap(*this);
		return *this;
	}